

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_features.c
# Opt level: O0

void av1_set_speed_features_qindex_dependent(AV1_COMP *cpi,int speed)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  AV1_COMP *in_RDI;
  int qindex_thresh_4;
  int qindex [2];
  int qindex_high [2];
  int qindex_low [2];
  SEARCH_METHODS search_method;
  int qindex_thresh2_1;
  int qindex_thresh1_1;
  int aggr_2;
  int disable_rect_part;
  int qindex_thresh_3 [2];
  int aggr_1;
  int qthresh2;
  int qindex_thresh_2;
  int qindex_thresh2 [4];
  int qindex_thresh1 [4];
  int aggr;
  int qindex_thresh_1;
  int qindex_thresh;
  int is_arf2_bwd_type;
  int is_1440p_or_larger;
  int is_1080p_or_larger;
  int is_720p_or_larger;
  int is_480p_or_larger;
  int is_480p_or_lesser;
  int boosted;
  WinnerModeParams *winner_mode_params;
  SPEED_FEATURES *sf;
  AV1_COMMON *cm;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  uint local_d8;
  int local_d4;
  int local_d0;
  int speed_00;
  int iVar3;
  int iVar4;
  undefined4 in_stack_ffffffffffffff44;
  int local_b8 [6];
  SEARCH_METHODS local_9d;
  int local_9c;
  int local_98;
  int local_94;
  uint local_90;
  int local_8c [4];
  int local_7c;
  int local_78 [10];
  int local_50;
  int local_4c;
  int local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_30;
  int local_2c;
  WinnerModeParams *local_28;
  SPEED_FEATURES *local_20;
  AV1_COMMON *local_18;
  int local_c;
  AV1_COMP *local_8;
  
  local_18 = &in_RDI->common;
  local_20 = &in_RDI->sf;
  local_28 = &in_RDI->winner_mode_params;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_2c = frame_is_boosted((AV1_COMP *)0x313ba5);
  if (local_18->width < local_18->height) {
    iVar1 = local_18->width;
  }
  else {
    iVar1 = local_18->height;
  }
  local_30 = (uint)(iVar1 < 0x1e1);
  if (local_18->width < local_18->height) {
    iVar4 = local_18->width;
  }
  else {
    iVar4 = local_18->height;
  }
  local_34 = (uint)(0x1df < iVar4);
  if (local_18->width < local_18->height) {
    iVar3 = local_18->width;
  }
  else {
    iVar3 = local_18->height;
  }
  local_38 = (uint)(0x2cf < iVar3);
  if (local_18->width < local_18->height) {
    speed_00 = local_18->width;
  }
  else {
    speed_00 = local_18->height;
  }
  local_3c = (uint)(0x437 < speed_00);
  if (local_18->width < local_18->height) {
    local_d0 = local_18->width;
  }
  else {
    local_d0 = local_18->height;
  }
  local_40 = (uint)(0x59f < local_d0);
  local_44 = (uint)((local_8->ppi->gf_group).update_type[local_8->gf_frame_index] == '\x06');
  if ((local_8->oxcf).mode == '\x01') {
    if (5 < local_c) {
      if (local_2c == 0) {
        local_d4 = 0x96;
        if (local_38 != 0) {
          local_d4 = 0x78;
        }
      }
      else {
        local_d4 = 0xbe;
      }
      local_48 = local_d4;
      iVar1 = frame_is_intra_only(local_18);
      if (iVar1 == 0) {
        local_d8 = (uint)(local_48 < (local_18->quant_params).base_qindex);
      }
      else {
        local_d8 = 0;
      }
      (local_20->part_sf).adjust_var_based_rd_partitioning = local_d8;
    }
  }
  else {
    if (local_c == 0) {
      if (local_2c == 0) {
        local_dc = 0x8c;
        if (local_44 != 0) {
          local_dc = 0x6e;
        }
      }
      else {
        local_dc = 0x46;
      }
      local_4c = local_dc;
      if ((local_38 == 0) && ((local_18->quant_params).base_qindex <= local_dc)) {
        iVar2 = 2;
        if (((local_18->features).allow_screen_content_tools & 1U) != 0) {
          iVar2 = 1;
        }
        (local_20->part_sf).simple_motion_search_split = iVar2;
        (local_20->part_sf).simple_motion_search_early_term_none = 1;
        (local_20->tx_sf).model_based_prune_tx_search_level = 0;
      }
      if ((local_38 != 0) && ((local_18->quant_params).base_qindex < 0x81)) {
        (local_20->rd_sf).perform_coeff_opt = local_3c + 2;
        iVar2 = (local_20->rd_sf).perform_coeff_opt;
        local_28->coeff_opt_thresholds[0] = coeff_opt_thresholds[iVar2][0];
        local_28->coeff_opt_thresholds[1] = coeff_opt_thresholds[iVar2][1];
        local_28->coeff_opt_thresholds[2] = coeff_opt_thresholds[iVar2][2];
        iVar2 = 2;
        if (((local_18->features).allow_screen_content_tools & 1U) != 0) {
          iVar2 = 1;
        }
        (local_20->part_sf).simple_motion_search_split = iVar2;
        (local_20->tx_sf).inter_tx_size_search_init_depth_rect = 1;
        (local_20->tx_sf).inter_tx_size_search_init_depth_sqr = 1;
        (local_20->tx_sf).intra_tx_size_search_init_depth_rect = 1;
        (local_20->tx_sf).model_based_prune_tx_search_level = 0;
        if ((local_3c != 0) && ((local_18->quant_params).base_qindex < 0x6d)) {
          (local_20->inter_sf).selective_ref_frame = 2;
          iVar2 = 2;
          if (local_2c != 0) {
            iVar2 = 1;
          }
          (local_20->rd_sf).tx_domain_dist_level = iVar2;
          (local_20->rd_sf).tx_domain_dist_thres_level = 1;
          (local_20->part_sf).simple_motion_search_early_term_none = 1;
          (local_20->tx_sf).tx_type_search.ml_tx_split_thresh = 4000;
          (local_20->interp_sf).cb_pred_filter_search = 0;
          (local_20->tx_sf).tx_type_search.prune_2d_txfm_mode = '\x02';
          (local_20->tx_sf).tx_type_search.skip_tx_search = 1;
        }
      }
    }
    if (1 < local_c) {
      if (local_c + -2 < 5) {
        local_e0 = local_c + -2;
      }
      else {
        local_e0 = 4;
      }
      local_50 = local_e0;
      local_78[4] = 0x32;
      local_78[5] = 0x32;
      local_78[6] = 0x50;
      local_78[7] = 100;
      local_78[0] = 0x50;
      local_78[1] = 100;
      local_78[2] = 0x78;
      local_78[3] = 0xa0;
      if (local_e0 < 2) {
        if ((local_e0 == 0) && (local_34 == 0)) {
          local_e4 = 0x46;
        }
        else {
          local_e4 = local_78[local_e0];
        }
        local_8c[3] = local_e4;
        if (((local_18->features).allow_screen_content_tools & 1U) == 0) {
          local_e8 = local_e4;
        }
        else {
          local_e8 = local_78[(long)local_e0 + 4];
        }
        local_7c = local_e8;
        if (((local_18->quant_params).base_qindex <= local_e8) && (local_2c == 0)) {
          (local_20->part_sf).ext_partition_eval_thresh = BLOCK_128X128;
        }
      }
      else if (local_e0 < 3) {
        if (local_2c == 0) {
          local_ec = local_78[local_e0];
        }
        else {
          local_ec = local_78[(long)local_e0 + 4];
        }
        local_7c = local_ec;
        if (((local_18->quant_params).base_qindex <= local_ec) &&
           (iVar2 = frame_is_intra_only(local_18), iVar2 == 0)) {
          (local_20->part_sf).ext_partition_eval_thresh = BLOCK_128X128;
        }
      }
      else if (local_e0 < 4) {
        if (local_34 == 0) {
          (local_20->part_sf).ext_partition_eval_thresh = BLOCK_128X128;
        }
        else if (((local_38 == 0) && (iVar2 = frame_is_intra_only(local_18), iVar2 == 0)) &&
                (((local_18->features).allow_screen_content_tools & 1U) == 0)) {
          (local_20->part_sf).ext_partition_eval_thresh = BLOCK_128X128;
        }
        else {
          if (local_2c == 0) {
            local_f0 = local_78[local_50];
          }
          else {
            local_f0 = local_78[(long)local_50 + 4];
          }
          local_7c = local_f0;
          if (((local_18->quant_params).base_qindex <= local_f0) &&
             (iVar2 = frame_is_intra_only(local_18), iVar2 == 0)) {
            (local_20->part_sf).ext_partition_eval_thresh = BLOCK_128X128;
          }
        }
      }
      else {
        (local_20->part_sf).ext_partition_eval_thresh = BLOCK_128X128;
      }
    }
    if (3 < local_c) {
      if (local_c + -4 < 2) {
        local_f4 = local_c + -4;
      }
      else {
        local_f4 = 1;
      }
      local_8c[2] = local_f4;
      local_8c[0] = 0x41;
      local_8c[1] = 0x50;
      local_90 = (uint)((local_2c != 0 ^ 0xffU) & 1);
      if ((((local_18->quant_params).base_qindex <= local_8c[local_f4]) && (local_90 != 0)) &&
         (local_34 != 0)) {
        (local_20->part_sf).rect_partition_eval_thresh = 3;
      }
    }
    if ((local_c < 3) && (iVar2 = is_stat_generation_stage(local_8), iVar2 == 0)) {
      local_94 = local_c;
      local_98 = ms_qindex_thresh[local_c][(int)local_38][0];
      local_9c = *(int *)((long)local_c * 0x10 + 0xbbf104 + (long)(int)local_38 * 8);
      local_9d = "\x03"[(int)local_38];
      if (local_98 < (local_18->quant_params).base_qindex) {
        (local_20->mv_sf).search_method = local_9d;
        (local_20->tpl_sf).search_method = local_9d;
      }
      else if (local_9c < (local_18->quant_params).base_qindex) {
        (local_20->mv_sf).search_method = '\x02';
      }
    }
    if (((3 < local_c) && (local_2c == 0)) && (local_44 == 0)) {
      local_b8[4] = 100;
      local_b8[5] = 0x3c;
      local_b8[2] = 0xb4;
      local_b8[3] = 0xa0;
      if (((local_18->quant_params).base_qindex <= local_b8[(long)(int)local_38 + 4]) ||
         (local_b8[(long)(int)local_38 + 2] < (local_18->quant_params).base_qindex)) {
        (local_20->lpf_sf).disable_loop_restoration_luma = 1;
      }
    }
    if ((((local_c == 1) && ((local_18->quant_params).base_qindex < 0xc9)) && (local_2c == 0)) &&
       (local_44 == 0)) {
      (local_20->inter_sf).reuse_mask_search_results = 1;
    }
    if (((local_c == 5) && (iVar2 = frame_is_intra_only(&local_8->common), iVar2 == 0)) &&
       ((((local_18->features).allow_screen_content_tools & 1U) == 0 &&
        (local_b8[0] = 0x100, local_b8[1] = 0x80,
        (local_18->quant_params).base_qindex < local_b8[(int)local_34])))) {
      (local_20->tx_sf).tx_type_search.winner_mode_tx_type_pruning = 3;
    }
    if (((4 < local_c) && (((local_18->features).allow_screen_content_tools & 1U) != 0)) &&
       (((local_18->quant_params).base_qindex < 0x80 && (local_30 != 0)))) {
      (local_20->part_sf).prune_sub_8x8_partition_level = 0;
    }
    (local_20->lpf_sf).min_lr_unit_size = 0x40;
    (local_20->lpf_sf).max_lr_unit_size = 0x100;
    if (0 < local_c) {
      if (local_40 == 0) {
        if (local_38 != 0) {
          (local_20->lpf_sf).min_lr_unit_size = 0x80;
        }
      }
      else {
        (local_20->lpf_sf).min_lr_unit_size = 0x100;
      }
    }
    if ((2 < local_c) || (((local_8->oxcf).mode == '\x02' && (0 < local_c)))) {
      in_stack_ffffffffffffff44 = 0x60;
      if (((local_18->quant_params).base_qindex < 0x61) && (local_40 == 0)) {
        (local_20->lpf_sf).min_lr_unit_size = 0x80;
        (local_20->lpf_sf).max_lr_unit_size = 0x80;
      }
      else {
        (local_20->lpf_sf).min_lr_unit_size = 0x100;
        (local_20->lpf_sf).max_lr_unit_size = 0x100;
      }
    }
    set_subpel_search_method
              (&local_8->mv_search_params,(local_8->oxcf).unit_test_cfg.motion_vector_unit_test,
               (local_20->mv_sf).subpel_search_method);
    if ((local_8->oxcf).enable_low_complexity_decode != 0) {
      set_speed_features_lc_dec_qindex_dependent
                ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff44,iVar1),
                 (SPEED_FEATURES *)CONCAT44(iVar4,iVar3),speed_00);
    }
  }
  return;
}

Assistant:

void av1_set_speed_features_qindex_dependent(AV1_COMP *cpi, int speed) {
  AV1_COMMON *const cm = &cpi->common;
  SPEED_FEATURES *const sf = &cpi->sf;
  WinnerModeParams *const winner_mode_params = &cpi->winner_mode_params;
  const int boosted = frame_is_boosted(cpi);
  const int is_480p_or_lesser = AOMMIN(cm->width, cm->height) <= 480;
  const int is_480p_or_larger = AOMMIN(cm->width, cm->height) >= 480;
  const int is_720p_or_larger = AOMMIN(cm->width, cm->height) >= 720;
  const int is_1080p_or_larger = AOMMIN(cm->width, cm->height) >= 1080;
  const int is_1440p_or_larger = AOMMIN(cm->width, cm->height) >= 1440;
  const int is_arf2_bwd_type =
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE;

  if (cpi->oxcf.mode == REALTIME) {
    if (speed >= 6) {
      const int qindex_thresh = boosted ? 190 : (is_720p_or_larger ? 120 : 150);
      sf->part_sf.adjust_var_based_rd_partitioning =
          frame_is_intra_only(cm)
              ? 0
              : cm->quant_params.base_qindex > qindex_thresh;
    }
    return;
  }

  if (speed == 0) {
    // qindex_thresh for resolution < 720p
    const int qindex_thresh = boosted ? 70 : (is_arf2_bwd_type ? 110 : 140);
    if (!is_720p_or_larger && cm->quant_params.base_qindex <= qindex_thresh) {
      sf->part_sf.simple_motion_search_split =
          cm->features.allow_screen_content_tools ? 1 : 2;
      sf->part_sf.simple_motion_search_early_term_none = 1;
      sf->tx_sf.model_based_prune_tx_search_level = 0;
    }

    if (is_720p_or_larger && cm->quant_params.base_qindex <= 128) {
      sf->rd_sf.perform_coeff_opt = 2 + is_1080p_or_larger;
      memcpy(winner_mode_params->coeff_opt_thresholds,
             &coeff_opt_thresholds[sf->rd_sf.perform_coeff_opt],
             sizeof(winner_mode_params->coeff_opt_thresholds));
      sf->part_sf.simple_motion_search_split =
          cm->features.allow_screen_content_tools ? 1 : 2;
      sf->tx_sf.inter_tx_size_search_init_depth_rect = 1;
      sf->tx_sf.inter_tx_size_search_init_depth_sqr = 1;
      sf->tx_sf.intra_tx_size_search_init_depth_rect = 1;
      sf->tx_sf.model_based_prune_tx_search_level = 0;

      if (is_1080p_or_larger && cm->quant_params.base_qindex <= 108) {
        sf->inter_sf.selective_ref_frame = 2;
        sf->rd_sf.tx_domain_dist_level = boosted ? 1 : 2;
        sf->rd_sf.tx_domain_dist_thres_level = 1;
        sf->part_sf.simple_motion_search_early_term_none = 1;
        sf->tx_sf.tx_type_search.ml_tx_split_thresh = 4000;
        sf->interp_sf.cb_pred_filter_search = 0;
        sf->tx_sf.tx_type_search.prune_2d_txfm_mode = TX_TYPE_PRUNE_2;
        sf->tx_sf.tx_type_search.skip_tx_search = 1;
      }
    }
  }

  if (speed >= 2) {
    // Disable extended partitions for lower quantizers
    const int aggr = AOMMIN(4, speed - 2);
    const int qindex_thresh1[4] = { 50, 50, 80, 100 };
    const int qindex_thresh2[4] = { 80, 100, 120, 160 };
    int qindex_thresh;
    if (aggr <= 1) {
      const int qthresh2 =
          (!aggr && !is_480p_or_larger) ? 70 : qindex_thresh2[aggr];
      qindex_thresh = cm->features.allow_screen_content_tools
                          ? qindex_thresh1[aggr]
                          : qthresh2;
      if (cm->quant_params.base_qindex <= qindex_thresh && !boosted)
        sf->part_sf.ext_partition_eval_thresh = BLOCK_128X128;
    } else if (aggr <= 2) {
      qindex_thresh = boosted ? qindex_thresh1[aggr] : qindex_thresh2[aggr];
      if (cm->quant_params.base_qindex <= qindex_thresh &&
          !frame_is_intra_only(cm))
        sf->part_sf.ext_partition_eval_thresh = BLOCK_128X128;
    } else if (aggr <= 3) {
      if (!is_480p_or_larger) {
        sf->part_sf.ext_partition_eval_thresh = BLOCK_128X128;
      } else if (!is_720p_or_larger && !frame_is_intra_only(cm) &&
                 !cm->features.allow_screen_content_tools) {
        sf->part_sf.ext_partition_eval_thresh = BLOCK_128X128;
      } else {
        qindex_thresh = boosted ? qindex_thresh1[aggr] : qindex_thresh2[aggr];
        if (cm->quant_params.base_qindex <= qindex_thresh &&
            !frame_is_intra_only(cm))
          sf->part_sf.ext_partition_eval_thresh = BLOCK_128X128;
      }
    } else {
      sf->part_sf.ext_partition_eval_thresh = BLOCK_128X128;
    }
  }

  if (speed >= 4) {
    // Disable rectangular partitions for lower quantizers
    const int aggr = AOMMIN(1, speed - 4);
    const int qindex_thresh[2] = { 65, 80 };
    int disable_rect_part;
    disable_rect_part = !boosted;
    if (cm->quant_params.base_qindex <= qindex_thresh[aggr] &&
        disable_rect_part && is_480p_or_larger) {
      sf->part_sf.rect_partition_eval_thresh = BLOCK_8X8;
    }
  }

  if (speed <= 2) {
    if (!is_stat_generation_stage(cpi)) {
      // Use faster full-pel motion search for high quantizers.
      // Also use reduced total search range for low resolutions at high
      // quantizers.
      const int aggr = speed;
      const int qindex_thresh1 = ms_qindex_thresh[aggr][is_720p_or_larger][0];
      const int qindex_thresh2 = ms_qindex_thresh[aggr][is_720p_or_larger][1];
      const SEARCH_METHODS search_method =
          motion_search_method[is_720p_or_larger];
      if (cm->quant_params.base_qindex > qindex_thresh1) {
        sf->mv_sf.search_method = search_method;
        sf->tpl_sf.search_method = search_method;
      } else if (cm->quant_params.base_qindex > qindex_thresh2) {
        sf->mv_sf.search_method = NSTEP_8PT;
      }
    }
  }

  if (speed >= 4) {
    // Disable LR search at low and high quantizers and enable only for
    // mid-quantizer range.
    if (!boosted && !is_arf2_bwd_type) {
      const int qindex_low[2] = { 100, 60 };
      const int qindex_high[2] = { 180, 160 };
      if (cm->quant_params.base_qindex <= qindex_low[is_720p_or_larger] ||
          cm->quant_params.base_qindex > qindex_high[is_720p_or_larger]) {
        sf->lpf_sf.disable_loop_restoration_luma = 1;
      }
    }
  }

  if (speed == 1) {
    // Reuse interinter wedge mask search from first search for non-boosted
    // non-internal-arf frames, except at very high quantizers.
    if (cm->quant_params.base_qindex <= 200) {
      if (!boosted && !is_arf2_bwd_type)
        sf->inter_sf.reuse_mask_search_results = 1;
    }
  }

  if (speed == 5) {
    if (!(frame_is_intra_only(&cpi->common) ||
          cm->features.allow_screen_content_tools)) {
      const int qindex[2] = { 256, 128 };
      // Set the sf value as 3 for low resolution and
      // for higher resolutions with low quantizers.
      if (cm->quant_params.base_qindex < qindex[is_480p_or_larger])
        sf->tx_sf.tx_type_search.winner_mode_tx_type_pruning = 3;
    }
  }

  if (speed >= 5) {
    // Disable the sf for low quantizers in case of low resolution screen
    // contents.
    if (cm->features.allow_screen_content_tools &&
        cm->quant_params.base_qindex < 128 && is_480p_or_lesser) {
      sf->part_sf.prune_sub_8x8_partition_level = 0;
    }
  }

  // Loop restoration size search
  // At speed 0, always search all available sizes for the maximum possible gain
  sf->lpf_sf.min_lr_unit_size = RESTORATION_PROC_UNIT_SIZE;
  sf->lpf_sf.max_lr_unit_size = RESTORATION_UNITSIZE_MAX;

  if (speed >= 1) {
    // For large frames, small restoration units are almost never useful,
    // so prune them away
    if (is_1440p_or_larger) {
      sf->lpf_sf.min_lr_unit_size = RESTORATION_UNITSIZE_MAX;
    } else if (is_720p_or_larger) {
      sf->lpf_sf.min_lr_unit_size = RESTORATION_UNITSIZE_MAX >> 1;
    }
  }

  if (speed >= 3 || (cpi->oxcf.mode == ALLINTRA && speed >= 1)) {
    // At this speed, a full search is too expensive. Instead, pick a single
    // size based on size and qindex. Note that, in general, higher quantizers
    // (== lower quality) and larger frames generally want to use larger
    // restoration units.
    int qindex_thresh = 96;
    if (cm->quant_params.base_qindex <= qindex_thresh && !is_1440p_or_larger) {
      sf->lpf_sf.min_lr_unit_size = RESTORATION_UNITSIZE_MAX >> 1;
      sf->lpf_sf.max_lr_unit_size = RESTORATION_UNITSIZE_MAX >> 1;
    } else {
      sf->lpf_sf.min_lr_unit_size = RESTORATION_UNITSIZE_MAX;
      sf->lpf_sf.max_lr_unit_size = RESTORATION_UNITSIZE_MAX;
    }
  }

  set_subpel_search_method(&cpi->mv_search_params,
                           cpi->oxcf.unit_test_cfg.motion_vector_unit_test,
                           sf->mv_sf.subpel_search_method);

  if (cpi->oxcf.enable_low_complexity_decode)
    set_speed_features_lc_dec_qindex_dependent(cpi, sf, speed);
}